

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool ClipperLib::SlopesEqual(TEdge *e1,TEdge *e2,bool UseFullInt64Range)

{
  undefined7 in_register_00000011;
  bool bVar1;
  Int128 local_68;
  Int128 local_58;
  long local_48;
  long local_40;
  Int128 local_38;
  Int128 local_28;
  
  if ((int)CONCAT71(in_register_00000011,UseFullInt64Range) == 0) {
    bVar1 = (e2->xtop - e2->xbot) * (e1->ytop - e1->ybot) -
            (e2->ytop - e2->ybot) * (e1->xtop - e1->xbot) == 0;
  }
  else {
    local_38.lo = e1->ytop - e1->ybot;
    local_38.hi = local_38.lo >> 0x3f;
    local_40 = e2->xtop - e2->xbot;
    local_48 = local_40 >> 0x3f;
    Int128::operator*(&local_28,&local_38);
    local_68.lo = e1->xtop - e1->xbot;
    local_68.hi = local_68.lo >> 0x3f;
    Int128::operator*(&local_58,&local_68);
    bVar1 = local_58.lo == local_28.lo && local_28.hi == local_58.hi;
  }
  return bVar1;
}

Assistant:

bool SlopesEqual(TEdge &e1, TEdge &e2, bool UseFullInt64Range)
{
  if (UseFullInt64Range)
    return Int128(e1.ytop - e1.ybot) * Int128(e2.xtop - e2.xbot) ==
      Int128(e1.xtop - e1.xbot) * Int128(e2.ytop - e2.ybot);
  else return (e1.ytop - e1.ybot)*(e2.xtop - e2.xbot) ==
      (e1.xtop - e1.xbot)*(e2.ytop - e2.ybot);
}